

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::Builtins::registerSystemTasks(Builtins *this)

{
  StringType *pSVar1;
  PredefinedIntegerType *__args_2;
  VoidType *__args_2_00;
  SymbolKind SVar2;
  int iVar3;
  SymbolKind SVar4;
  int iVar5;
  bool bVar6;
  initializer_list<const_slang::ast::Type_*> __l;
  initializer_list<const_slang::ast::Type_*> __l_00;
  initializer_list<const_slang::ast::Type_*> __l_01;
  initializer_list<const_slang::ast::Type_*> __l_02;
  initializer_list<const_slang::ast::Type_*> __l_03;
  initializer_list<const_slang::ast::Type_*> __l_04;
  initializer_list<const_slang::ast::Type_*> __l_05;
  initializer_list<const_slang::ast::Type_*> __l_06;
  initializer_list<const_slang::ast::Type_*> __l_07;
  initializer_list<const_slang::ast::Type_*> __l_08;
  initializer_list<const_slang::ast::Type_*> __l_09;
  initializer_list<const_slang::ast::Type_*> __l_10;
  initializer_list<const_slang::ast::Type_*> __l_11;
  initializer_list<const_slang::ast::Type_*> __l_12;
  initializer_list<const_slang::ast::Type_*> __l_13;
  initializer_list<const_slang::ast::Type_*> __l_14;
  initializer_list<const_slang::ast::Type_*> __l_15;
  allocator_type local_6d1;
  undefined1 local_6d0 [8];
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_6c8;
  Scope *local_6b0;
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_6a8;
  undefined1 local_688 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_660;
  shared_ptr<slang::ast::SystemSubroutine> local_658;
  shared_ptr<slang::ast::SystemSubroutine> local_648;
  shared_ptr<slang::ast::SystemSubroutine> local_638;
  shared_ptr<slang::ast::SystemSubroutine> local_628;
  shared_ptr<slang::ast::SystemSubroutine> local_618;
  shared_ptr<slang::ast::SystemSubroutine> local_608;
  shared_ptr<slang::ast::SystemSubroutine> local_5f8;
  shared_ptr<slang::ast::SystemSubroutine> local_5e8;
  shared_ptr<slang::ast::SystemSubroutine> local_5d8;
  shared_ptr<slang::ast::SystemSubroutine> local_5c8;
  shared_ptr<slang::ast::SystemSubroutine> local_5b8;
  shared_ptr<slang::ast::SystemSubroutine> local_5a8;
  shared_ptr<slang::ast::SystemSubroutine> local_598;
  shared_ptr<slang::ast::SystemSubroutine> local_588;
  shared_ptr<slang::ast::SystemSubroutine> local_578;
  shared_ptr<slang::ast::SystemSubroutine> local_568;
  shared_ptr<slang::ast::SystemSubroutine> local_558;
  shared_ptr<slang::ast::SystemSubroutine> local_548;
  shared_ptr<slang::ast::SystemSubroutine> local_538;
  shared_ptr<slang::ast::SystemSubroutine> local_528;
  shared_ptr<slang::ast::SystemSubroutine> local_518;
  shared_ptr<slang::ast::SystemSubroutine> local_508;
  shared_ptr<slang::ast::SystemSubroutine> local_4f8;
  shared_ptr<slang::ast::SystemSubroutine> local_4e8;
  shared_ptr<slang::ast::SystemSubroutine> local_4d8;
  shared_ptr<slang::ast::SystemSubroutine> local_4c8;
  shared_ptr<slang::ast::SystemSubroutine> local_4b8;
  shared_ptr<slang::ast::SystemSubroutine> local_4a8;
  shared_ptr<slang::ast::SystemSubroutine> local_498;
  shared_ptr<slang::ast::SystemSubroutine> local_488;
  shared_ptr<slang::ast::SystemSubroutine> local_478;
  shared_ptr<slang::ast::SystemSubroutine> local_468;
  shared_ptr<slang::ast::SystemSubroutine> local_458;
  shared_ptr<slang::ast::SystemSubroutine> local_448;
  shared_ptr<slang::ast::SystemSubroutine> local_438;
  shared_ptr<slang::ast::SystemSubroutine> local_428;
  shared_ptr<slang::ast::SystemSubroutine> local_418;
  shared_ptr<slang::ast::SystemSubroutine> local_408;
  shared_ptr<slang::ast::SystemSubroutine> local_3f8;
  shared_ptr<slang::ast::SystemSubroutine> local_3e8;
  shared_ptr<slang::ast::SystemSubroutine> local_3d8;
  shared_ptr<slang::ast::SystemSubroutine> local_3c8;
  shared_ptr<slang::ast::SystemSubroutine> local_3b8;
  shared_ptr<slang::ast::SystemSubroutine> local_3a8;
  shared_ptr<slang::ast::SystemSubroutine> local_398;
  shared_ptr<slang::ast::SystemSubroutine> local_388;
  shared_ptr<slang::ast::SystemSubroutine> local_378;
  shared_ptr<slang::ast::SystemSubroutine> local_368;
  shared_ptr<slang::ast::SystemSubroutine> local_358;
  shared_ptr<slang::ast::SystemSubroutine> local_348;
  shared_ptr<slang::ast::SystemSubroutine> local_338;
  shared_ptr<slang::ast::SystemSubroutine> local_328;
  shared_ptr<slang::ast::SystemSubroutine> local_318;
  shared_ptr<slang::ast::SystemSubroutine> local_308;
  shared_ptr<slang::ast::SystemSubroutine> local_2f8;
  shared_ptr<slang::ast::SystemSubroutine> local_2e8;
  shared_ptr<slang::ast::SystemSubroutine> local_2d8;
  shared_ptr<slang::ast::SystemSubroutine> local_2c8;
  shared_ptr<slang::ast::SystemSubroutine> local_2b8;
  shared_ptr<slang::ast::SystemSubroutine> local_2a8;
  shared_ptr<slang::ast::SystemSubroutine> local_298;
  shared_ptr<slang::ast::SystemSubroutine> local_288;
  shared_ptr<slang::ast::SystemSubroutine> local_278;
  shared_ptr<slang::ast::SystemSubroutine> local_268;
  shared_ptr<slang::ast::SystemSubroutine> local_258;
  shared_ptr<slang::ast::SystemSubroutine> local_248;
  shared_ptr<slang::ast::SystemSubroutine> local_238;
  shared_ptr<slang::ast::SystemSubroutine> local_228;
  shared_ptr<slang::ast::SystemSubroutine> local_218;
  shared_ptr<slang::ast::SystemSubroutine> local_208;
  shared_ptr<slang::ast::SystemSubroutine> local_1f8;
  shared_ptr<slang::ast::SystemSubroutine> local_1e8;
  shared_ptr<slang::ast::SystemSubroutine> local_1d8;
  shared_ptr<slang::ast::SystemSubroutine> local_1c8;
  shared_ptr<slang::ast::SystemSubroutine> local_1b8;
  shared_ptr<slang::ast::SystemSubroutine> local_1a8;
  shared_ptr<slang::ast::SystemSubroutine> local_198;
  shared_ptr<slang::ast::SystemSubroutine> local_188;
  shared_ptr<slang::ast::SystemSubroutine> local_178;
  shared_ptr<slang::ast::SystemSubroutine> local_168;
  shared_ptr<slang::ast::SystemSubroutine> local_158;
  shared_ptr<slang::ast::SystemSubroutine> local_148;
  shared_ptr<slang::ast::SystemSubroutine> local_138;
  shared_ptr<slang::ast::SystemSubroutine> local_128;
  shared_ptr<slang::ast::SystemSubroutine> local_118;
  shared_ptr<slang::ast::SystemSubroutine> local_108;
  shared_ptr<slang::ast::SystemSubroutine> local_f8;
  shared_ptr<slang::ast::SystemSubroutine> local_e8;
  shared_ptr<slang::ast::SystemSubroutine> local_d8;
  shared_ptr<slang::ast::SystemSubroutine> local_c8;
  shared_ptr<slang::ast::SystemSubroutine> local_b8;
  shared_ptr<slang::ast::SystemSubroutine> local_a8;
  shared_ptr<slang::ast::SystemSubroutine> local_98;
  shared_ptr<slang::ast::SystemSubroutine> local_88;
  shared_ptr<slang::ast::SystemSubroutine> local_78;
  shared_ptr<slang::ast::SystemSubroutine> local_68;
  shared_ptr<slang::ast::SystemSubroutine> local_58;
  shared_ptr<slang::ast::SystemSubroutine> local_48;
  
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x87;
  local_688[0] = Definition;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x88;
  local_688[0] = Unknown;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x89;
  local_688[0] = Root;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x8a;
  local_688[0] = CompilationUnit;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x8b;
  local_688[0] = Definition;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x8c;
  local_688[0] = Unknown;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x8d;
  local_688[0] = Root;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x8e;
  local_688[0] = CompilationUnit;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x8f;
  local_688[0] = Definition;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x90;
  local_688[0] = Unknown;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x91;
  local_688[0] = Root;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x92;
  local_688[0] = CompilationUnit;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x93;
  local_688[0] = Definition;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x94;
  local_688[0] = Unknown;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x95;
  local_688[0] = Root;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x96;
  local_688[0] = 3;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)&local_6c8,(LiteralBase *)&local_6a8);
  local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_138);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x97;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x98;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x99;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x9a;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_178);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x9b;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x9c;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x9d;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x9e;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x9f;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xa0;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xa1;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xa2;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xa3;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_208);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xa4;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_218);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xa5;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_228);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xa6;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xa7;
  std::make_shared<slang::ast::builtins::StringOutputTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xa8;
  std::make_shared<slang::ast::builtins::StringOutputTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_258);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xa9;
  std::make_shared<slang::ast::builtins::StringOutputTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_268);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xaa;
  std::make_shared<slang::ast::builtins::StringOutputTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xab;
  std::make_shared<slang::ast::builtins::StringFormatTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_288.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_288.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_288);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_288.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xac;
  std::make_shared<slang::ast::builtins::PrintTimeScaleTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_298.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_298.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_298);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_298.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xad;
  std::make_shared<slang::ast::builtins::DumpVarsTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_2a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_2a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xae;
  std::make_shared<slang::ast::builtins::DumpPortsTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_2b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_2b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xaf;
  std::make_shared<slang::ast::builtins::ShowVarsTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_2c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_2c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x77;
  std::make_shared<slang::ast::builtins::CastTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_2d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_2d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x78;
  local_688._0_4_ = CompilationUnit;
  std::
  make_shared<slang::ast::builtins::SeverityTask,slang::parsing::KnownSystemName,slang::ast::ElabSystemTaskKind>
            ((KnownSystemName *)&local_6c8,(ElabSystemTaskKind *)&local_6a8);
  local_2e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_2e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x79;
  local_688._0_4_ = Definition;
  std::
  make_shared<slang::ast::builtins::SeverityTask,slang::parsing::KnownSystemName,slang::ast::ElabSystemTaskKind>
            ((KnownSystemName *)&local_6c8,(ElabSystemTaskKind *)&local_6a8);
  local_2f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_2f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_2f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x7a;
  local_688._0_4_ = 1;
  std::
  make_shared<slang::ast::builtins::SeverityTask,slang::parsing::KnownSystemName,slang::ast::ElabSystemTaskKind>
            ((KnownSystemName *)&local_6c8,(ElabSystemTaskKind *)&local_6a8);
  local_308.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_308.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_308);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_308.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x7b;
  local_688[0] = Root;
  std::make_shared<slang::ast::builtins::FinishControlTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)&local_6c8,(bool *)&local_6a8);
  local_318.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_318.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_318);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_318.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x7c;
  local_688[0] = Unknown;
  std::make_shared<slang::ast::builtins::FinishControlTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)&local_6c8,(bool *)&local_6a8);
  local_328.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_328.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_328);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_328.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb0;
  local_688[0] = Root;
  std::make_shared<slang::ast::builtins::ReadWriteMemTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)&local_6c8,(bool *)&local_6a8);
  local_338.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_338.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_338);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_338.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb1;
  local_688[0] = Root;
  std::make_shared<slang::ast::builtins::ReadWriteMemTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)&local_6c8,(bool *)&local_6a8);
  local_348.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_348.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_348);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_348.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb2;
  local_688[0] = Unknown;
  std::make_shared<slang::ast::builtins::ReadWriteMemTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)&local_6c8,(bool *)&local_6a8);
  local_358.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_358.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_358);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_358.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb3;
  local_688._0_8_ = (ulong)(uint7)local_688._1_7_ << 8;
  std::make_shared<slang::ast::builtins::ReadWriteMemTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)&local_6c8,(bool *)&local_6a8);
  local_368.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_368.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_368);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_368.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb4;
  std::make_shared<slang::ast::builtins::SReadMemTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_378.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_378.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_378);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_378.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8._M_impl.super__Vector_impl_data._M_start._4_4_,0xb5);
  std::make_shared<slang::ast::builtins::SReadMemTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_388.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_388.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_388);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_388.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6d0._4_4_ = 0;
  local_6d0._0_4_ = 0xb6;
  pSVar1 = &this->stringType;
  __l._M_len = 1;
  __l._M_array = (iterator)local_688;
  local_688._0_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l,&local_6d1);
  __args_2 = &this->intType;
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(PredefinedIntegerType *)local_6d0,(int *)__args_2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_398.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_398.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_398);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_398.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  std::make_shared<slang::ast::builtins::SdfAnnotateTask>();
  local_3a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_3a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_3a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  std::make_shared<slang::ast::builtins::StaticAssertTask>();
  local_3b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_3b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_3b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  std::make_shared<slang::ast::builtins::FatalTask>();
  local_3c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_3c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_3c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb7;
  local_688[0] = Root;
  std::make_shared<slang::ast::builtins::ScopeTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)&local_6c8,(bool *)&local_6a8);
  local_3d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_3d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_3d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8._M_impl.super__Vector_impl_data._M_start._4_4_,0xb8);
  local_688._0_8_ = (ulong)(uint7)local_688._1_7_ << 8;
  std::make_shared<slang::ast::builtins::ScopeTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)&local_6c8,(bool *)&local_6a8);
  local_3e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_3e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_3e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6d0._0_4_ = Unknown;
  local_688._0_4_ = 0xb9;
  __args_2_00 = &this->voidType;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_688,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_6d0);
  local_3f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_3f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_3f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._0_4_ = 0xba;
  local_6d0._4_4_ = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_6c8;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)__args_2;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)__args_2;
  local_6c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pSVar1;
  local_6b0 = (Scope *)__args_2;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6a8,__l_00,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)local_688,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_408.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_688._0_8_;
  local_408.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_688._8_8_;
  local_688._0_8_ = (Type *)0x0;
  local_688._8_8_ = 0;
  addSystemSubroutine(this,&local_408);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_408.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_688 + 8));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6a8);
  local_688._0_4_ = 0xbb;
  local_6d0._0_4_ = Unknown;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_688,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_6d0);
  local_418.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_418.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_418);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_418.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_688._0_4_ = 0xbc;
  local_6d0._0_4_ = Unknown;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_688,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_6d0);
  local_428.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_428.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_428);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_428.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._4_4_ = 0;
  local_6d0._0_4_ = 0xbd;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_688;
  local_688._0_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_01,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_438.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_438.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_438);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_438.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_688._0_4_ = 0xbe;
  local_6d0._0_4_ = Unknown;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_688,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_6d0);
  local_448.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_448.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_448);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_448.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_688._0_4_ = 0xbf;
  local_6d0._0_4_ = Unknown;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_688,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_6d0);
  local_458.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_458.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_458);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_458.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_688._0_4_ = 0xc0;
  local_6d0._0_4_ = Unknown;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_688,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_6d0);
  local_468.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_468.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_468);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_468.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._0_4_ = 0xc1;
  local_6d0._4_4_ = 1;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_688;
  local_688._0_8_ = __args_2;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_02,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_478.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_478.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_478);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_478.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_688._0_4_ = 0xc2;
  local_6d0._0_4_ = Unknown;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_688,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_6d0);
  local_488.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_488.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_488);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_488.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._4_4_ = 0;
  local_6d0._0_4_ = 0xc3;
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_688;
  local_688._0_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_03,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_498.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_498.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_498);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_498.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._4_4_ = 0;
  local_6d0._0_4_ = 0xc4;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)local_688;
  local_688._0_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_04,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_4a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_4a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_4a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._4_4_ = 0;
  local_6d0._0_4_ = 0xc5;
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)local_688;
  local_688._0_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_05,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_4b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_4b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_4b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._0_4_ = 0xc6;
  local_6d0._4_4_ = 1;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)local_688;
  local_688._0_8_ = __args_2;
  local_688._8_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_06,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_4c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_4c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_4c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._4_4_ = 0;
  local_6d0._0_4_ = 199;
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)local_688;
  local_688._0_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_07,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_4d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_4d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_4d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._0_4_ = 200;
  local_6d0._4_4_ = 1;
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)local_688;
  local_688._0_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_08,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_4e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_4e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_4e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._4_4_ = 0;
  local_6d0._0_4_ = 0xc9;
  __l_09._M_len = 1;
  __l_09._M_array = (iterator)local_688;
  local_688._0_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_09,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_4f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_4f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_4f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_688._0_4_ = 0xca;
  local_6d0._0_4_ = Unknown;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_688,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_6d0);
  local_508.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_508.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_508);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_508.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._4_4_ = 0;
  local_6d0._0_4_ = 0xcb;
  __l_10._M_len = 1;
  __l_10._M_array = (iterator)local_688;
  local_688._0_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_10,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_518.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_518.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_518);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_518.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_688._0_4_ = 0xcc;
  local_6d0._0_4_ = Unknown;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_688,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             local_6d0);
  local_528.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_528.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_528);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_528.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._0_4_ = 0xcd;
  local_6d0._4_4_ = 0;
  __l_11._M_len = 3;
  __l_11._M_array = (iterator)&local_6a8;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)__args_2;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)__args_2;
  local_6a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__args_2;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_11,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)local_688,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_538.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_688._0_8_;
  local_538.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_688._8_8_;
  local_688._0_8_ = (Type *)0x0;
  local_688._8_8_ = 0;
  addSystemSubroutine(this,&local_538);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_538.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_688 + 8));
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._0_4_ = 0xce;
  local_6d0._4_4_ = 1;
  __l_12._M_len = 1;
  __l_12._M_array = (iterator)local_688;
  local_688._0_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_12,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_548.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_548.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_548);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_548.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._0_4_ = 0xcf;
  local_6d0._4_4_ = 1;
  __l_13._M_len = 1;
  __l_13._M_array = (iterator)local_688;
  local_688._0_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_13,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_558.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_558.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_558);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_558.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._0_4_ = 0xd0;
  local_6d0._4_4_ = 1;
  __l_14._M_len = 1;
  __l_14._M_array = (iterator)local_688;
  local_688._0_8_ = pSVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_14,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_568.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_568.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_568);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_568.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6d0._4_4_ = 0;
  local_6d0._0_4_ = 0xd1;
  __l_15._M_len = 1;
  __l_15._M_array = (iterator)local_688;
  local_688._0_8_ = __args_2;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_6c8,__l_15,&local_6d1);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)&local_6a8,(VoidType *)local_6d0,(int *)__args_2_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             (local_6d0 + 4));
  local_578.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6a8._M_impl.super__Vector_impl_data._M_start;
  local_578.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6a8._M_impl.super__Vector_impl_data._M_finish;
  local_6a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_578);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_578.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6a8._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_6c8);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x7d;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_588.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_588.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_588);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_588.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x7e;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_598.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_598.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_598);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_598.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x7f;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_5a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_5a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_5a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x80;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_5b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_5b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_5b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x81;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_5c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_5c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_5c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x82;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_5d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_5d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_5d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x83;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_5e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_5e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_5e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x84;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_5f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_5f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_5f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_5f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x85;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_608.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_608.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_608);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_608.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x86;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)&local_6c8);
  local_618.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_618.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_618);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_618.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xd2;
  SVar4 = Root;
  local_688._0_4_ = Root;
  local_6d0._0_4_ = CompilationUnit;
  local_6d0._4_4_ = SVar4;
  std::
  make_shared<slang::ast::builtins::StochasticTask,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            ((KnownSystemName *)&local_6c8,(SubroutineKind *)&local_6a8,(int *)local_688,
             (int *)local_6d0);
  local_628.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_628.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_628);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_628.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xd3;
  local_688._0_4_ = Root;
  local_6d0._0_4_ = CompilationUnit;
  local_6d0._4_4_ = SVar4;
  std::
  make_shared<slang::ast::builtins::StochasticTask,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            ((KnownSystemName *)&local_6c8,(SubroutineKind *)&local_6a8,(int *)local_688,
             (int *)local_6d0);
  local_638.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_638.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_638);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_638.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xd4;
  local_688._0_4_ = Root;
  SVar2 = Definition;
  local_6d0._0_4_ = SVar2;
  local_6d0._4_4_ = SVar2;
  std::
  make_shared<slang::ast::builtins::StochasticTask,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            ((KnownSystemName *)&local_6c8,(SubroutineKind *)&local_6a8,(int *)local_688,
             (int *)local_6d0);
  local_648.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_648.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_648);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_648.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xd5;
  local_688._0_4_ = Root;
  local_6d0._0_4_ = SVar2;
  local_6d0._4_4_ = SVar2;
  std::
  make_shared<slang::ast::builtins::StochasticTask,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            ((KnownSystemName *)&local_6c8,(SubroutineKind *)&local_6a8,(int *)local_688,
             (int *)local_6d0);
  local_658.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_6c8._M_impl.super__Vector_impl_data._M_start;
  local_658.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,&local_658);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_658.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  local_6a8._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_6a8._M_impl.super__Vector_impl_data._M_start._4_4_,0xd6);
  local_688._0_8_ = (ulong)(uint)local_688._4_4_ << 0x20;
  local_6d0._0_4_ = SVar4;
  local_6d0._4_4_ = SVar4;
  std::
  make_shared<slang::ast::builtins::StochasticTask,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            ((KnownSystemName *)&local_6c8,(SubroutineKind *)&local_6a8,(int *)local_688,
             (int *)local_6d0);
  local_688._32_8_ = local_6c8._M_impl.super__Vector_impl_data._M_start;
  _Stack_660._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_6c8._M_impl.super__Vector_impl_data._M_finish;
  local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(local_688 + 0x20));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_660);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_6c8._M_impl.super__Vector_impl_data._M_finish);
  iVar3 = 0;
  iVar5 = 0x10;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    local_6a8._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_6a8._M_impl.super__Vector_impl_data._M_start._4_4_,iVar3 + 0xd7);
    std::make_shared<slang::ast::builtins::PlaTask,slang::parsing::KnownSystemName>
              ((KnownSystemName *)&local_6c8);
    local_688._16_8_ = local_6c8._M_impl.super__Vector_impl_data._M_start;
    local_688._24_8_ = local_6c8._M_impl.super__Vector_impl_data._M_finish;
    local_6c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_6c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(local_688 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_688 + 0x18));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_6c8._M_impl.super__Vector_impl_data._M_finish);
    iVar3 = iVar3 + 1;
  }
  return;
}

Assistant:

void Builtins::registerSystemTasks() {
    using parsing::KnownSystemName;

#define REGISTER(type, name, base) addSystemSubroutine(std::make_shared<type>(name, base))
    REGISTER(DisplayTask, KnownSystemName::Display, LiteralBase::Decimal);
    REGISTER(DisplayTask, KnownSystemName::DisplayB, LiteralBase::Binary);
    REGISTER(DisplayTask, KnownSystemName::DisplayO, LiteralBase::Octal);
    REGISTER(DisplayTask, KnownSystemName::DisplayH, LiteralBase::Hex);
    REGISTER(DisplayTask, KnownSystemName::Write, LiteralBase::Decimal);
    REGISTER(DisplayTask, KnownSystemName::WriteB, LiteralBase::Binary);
    REGISTER(DisplayTask, KnownSystemName::WriteO, LiteralBase::Octal);
    REGISTER(DisplayTask, KnownSystemName::WriteH, LiteralBase::Hex);
    REGISTER(MonitorTask, KnownSystemName::Strobe, LiteralBase::Decimal);
    REGISTER(MonitorTask, KnownSystemName::StrobeB, LiteralBase::Binary);
    REGISTER(MonitorTask, KnownSystemName::StrobeO, LiteralBase::Octal);
    REGISTER(MonitorTask, KnownSystemName::StrobeH, LiteralBase::Hex);
    REGISTER(MonitorTask, KnownSystemName::Monitor, LiteralBase::Decimal);
    REGISTER(MonitorTask, KnownSystemName::MonitorB, LiteralBase::Binary);
    REGISTER(MonitorTask, KnownSystemName::MonitorO, LiteralBase::Octal);
    REGISTER(MonitorTask, KnownSystemName::MonitorH, LiteralBase::Hex);

#undef REGISTER
#define REGISTER(type, name) addSystemSubroutine(std::make_shared<type>(name))
    REGISTER(FileDisplayTask, KnownSystemName::FDisplay);
    REGISTER(FileDisplayTask, KnownSystemName::FDisplayB);
    REGISTER(FileDisplayTask, KnownSystemName::FDisplayO);
    REGISTER(FileDisplayTask, KnownSystemName::FDisplayH);
    REGISTER(FileDisplayTask, KnownSystemName::FWrite);
    REGISTER(FileDisplayTask, KnownSystemName::FWriteB);
    REGISTER(FileDisplayTask, KnownSystemName::FWriteO);
    REGISTER(FileDisplayTask, KnownSystemName::FWriteH);
    REGISTER(FileMonitorTask, KnownSystemName::FStrobe);
    REGISTER(FileMonitorTask, KnownSystemName::FStrobeB);
    REGISTER(FileMonitorTask, KnownSystemName::FStrobeO);
    REGISTER(FileMonitorTask, KnownSystemName::FStrobeH);
    REGISTER(FileMonitorTask, KnownSystemName::FMonitor);
    REGISTER(FileMonitorTask, KnownSystemName::FMonitorB);
    REGISTER(FileMonitorTask, KnownSystemName::FMonitorO);
    REGISTER(FileMonitorTask, KnownSystemName::FMonitorH);

    REGISTER(StringOutputTask, KnownSystemName::SWrite);
    REGISTER(StringOutputTask, KnownSystemName::SWriteB);
    REGISTER(StringOutputTask, KnownSystemName::SWriteO);
    REGISTER(StringOutputTask, KnownSystemName::SWriteH);

    REGISTER(StringFormatTask, KnownSystemName::SFormat);

    REGISTER(PrintTimeScaleTask, KnownSystemName::PrintTimeScale);

    REGISTER(DumpVarsTask, KnownSystemName::DumpVars);
    REGISTER(DumpPortsTask, KnownSystemName::DumpPorts);
    REGISTER(ShowVarsTask, KnownSystemName::ShowVars);

    REGISTER(CastTask, KnownSystemName::Cast);

#undef REGISTER
#define REGISTER(type, name, kind) addSystemSubroutine(std::make_shared<type>(name, kind))
    REGISTER(SeverityTask, KnownSystemName::Info, ElabSystemTaskKind::Info);
    REGISTER(SeverityTask, KnownSystemName::Warning, ElabSystemTaskKind::Warning);
    REGISTER(SeverityTask, KnownSystemName::Error, ElabSystemTaskKind::Error);

#undef REGISTER
#define REGISTER(type, name, isFinish) addSystemSubroutine(std::make_shared<type>(name, isFinish))
    REGISTER(FinishControlTask, KnownSystemName::Finish, true);
    REGISTER(FinishControlTask, KnownSystemName::Stop, false);

#undef REGISTER

    addSystemSubroutine(std::make_shared<ReadWriteMemTask>(KnownSystemName::ReadMemB, true));
    addSystemSubroutine(std::make_shared<ReadWriteMemTask>(KnownSystemName::ReadMemH, true));
    addSystemSubroutine(std::make_shared<ReadWriteMemTask>(KnownSystemName::WriteMemB, false));
    addSystemSubroutine(std::make_shared<ReadWriteMemTask>(KnownSystemName::WriteMemH, false));
    addSystemSubroutine(std::make_shared<SReadMemTask>(KnownSystemName::SReadMemB));
    addSystemSubroutine(std::make_shared<SReadMemTask>(KnownSystemName::SReadMemH));
    addSystemSubroutine(std::make_shared<SimpleSystemTask>(KnownSystemName::System, intType, 0,
                                                           std::vector<const Type*>{&stringType}));
    addSystemSubroutine(std::make_shared<SdfAnnotateTask>());
    addSystemSubroutine(std::make_shared<StaticAssertTask>());
    addSystemSubroutine(std::make_shared<FatalTask>());
    addSystemSubroutine(std::make_shared<ScopeTask>(KnownSystemName::List, true));
    addSystemSubroutine(std::make_shared<ScopeTask>(KnownSystemName::Scope, false));

#define TASK(name, required, ...)                                                    \
    addSystemSubroutine(std::make_shared<SimpleSystemTask>(name, voidType, required, \
                                                           std::vector<const Type*>{__VA_ARGS__}))

    TASK(KnownSystemName::Exit, 0, );

    TASK(KnownSystemName::TimeFormat, 0, &intType, &intType, &stringType, &intType);

    TASK(KnownSystemName::MonitorOn, 0, );
    TASK(KnownSystemName::MonitorOff, 0, );

    TASK(KnownSystemName::DumpFile, 0, &stringType);
    TASK(KnownSystemName::DumpOn, 0, );
    TASK(KnownSystemName::DumpOff, 0, );
    TASK(KnownSystemName::DumpAll, 0, );
    TASK(KnownSystemName::DumpLimit, 1, &intType);
    TASK(KnownSystemName::DumpFlush, 0, );
    TASK(KnownSystemName::DumpPortsOn, 0, &stringType);
    TASK(KnownSystemName::DumpPortsOff, 0, &stringType);
    TASK(KnownSystemName::DumpPortsAll, 0, &stringType);
    TASK(KnownSystemName::DumpPortsLimit, 1, &intType, &stringType);
    TASK(KnownSystemName::DumpPortsFlush, 0, &stringType);

    TASK(KnownSystemName::Input, 1, &stringType);
    TASK(KnownSystemName::Key, 0, &stringType);
    TASK(KnownSystemName::NoKey, 0, );
    TASK(KnownSystemName::Log, 0, &stringType);
    TASK(KnownSystemName::NoLog, 0, );
    TASK(KnownSystemName::Reset, 0, &intType, &intType, &intType);
    TASK(KnownSystemName::Save, 1, &stringType);
    TASK(KnownSystemName::Restart, 1, &stringType);
    TASK(KnownSystemName::IncSave, 1, &stringType);
    TASK(KnownSystemName::ShowScopes, 0, &intType);

#undef TASK

#define ASSERTCTRL(name) addSystemSubroutine(std::make_shared<AssertControlTask>(name))
    ASSERTCTRL(KnownSystemName::AssertControl);
    ASSERTCTRL(KnownSystemName::AssertOn);
    ASSERTCTRL(KnownSystemName::AssertOff);
    ASSERTCTRL(KnownSystemName::AssertKill);
    ASSERTCTRL(KnownSystemName::AssertPassOn);
    ASSERTCTRL(KnownSystemName::AssertPassOff);
    ASSERTCTRL(KnownSystemName::AssertFailOn);
    ASSERTCTRL(KnownSystemName::AssertFailOff);
    ASSERTCTRL(KnownSystemName::AssertNonvacuousOn);
    ASSERTCTRL(KnownSystemName::AssertVacuousOff);

#undef ASSERTCTRL

#define TASK(name, kind, input, output) \
    addSystemSubroutine(std::make_shared<StochasticTask>(name, kind, input, output))
    TASK(KnownSystemName::QInitialize, SubroutineKind::Task, 3, 1);
    TASK(KnownSystemName::QAdd, SubroutineKind::Task, 3, 1);
    TASK(KnownSystemName::QRemove, SubroutineKind::Task, 2, 2);
    TASK(KnownSystemName::QExam, SubroutineKind::Task, 2, 2);
    TASK(KnownSystemName::QFull, SubroutineKind::Function, 1, 1);

#undef TASK

    // There are 16 PLA tasks, with sequential enum values starting with $async$and$array
    for (int i = 0; i < 16; i++) {
        addSystemSubroutine(
            std::make_shared<PlaTask>((KnownSystemName)((int)KnownSystemName::AsyncAndArray + i)));
    }
}